

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O3

void use_unique_pointer(void)

{
  pointer pcVar1;
  undefined8 *puVar2;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  string *psVar4;
  pointer pbVar5;
  ostream *poVar6;
  int i;
  long lVar7;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  films [5];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  string *local_48 [2];
  pointer local_38;
  string *local_30;
  string *local_28;
  
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar4,"The Iron Man","");
  local_48[0] = psVar4;
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar4,"The amazing four","");
  local_48[1] = psVar4;
  pbVar5 = (pointer)operator_new(0x20);
  (pbVar5->_M_dataplus)._M_p = (pointer)&pbVar5->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar5,"Capital America","");
  local_38 = pbVar5;
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar4,"The spiderman","");
  local_30 = psVar4;
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar4,"The superman","");
  pbVar5 = local_38;
  local_50._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = (pointer)0x0;
  local_28 = psVar4;
  std::
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_50,pbVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The mavel movies are:\n",0x16);
  lVar7 = 0;
  do {
    psVar4 = local_48[lVar7];
    if (psVar4 == (string *)0x0) {
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," is empty",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)psVar4,*(long *)(psVar4 + 8));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The winner is ",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,((local_50._M_head_impl)->_M_dataplus)._M_p,
                      (local_50._M_head_impl)->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!\n",2);
  _Var3._M_head_impl = local_50._M_head_impl;
  if (local_50._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar1 = ((local_50._M_head_impl)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(local_50._M_head_impl)->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(_Var3._M_head_impl);
  }
  lVar7 = 0x20;
  do {
    puVar2 = *(undefined8 **)((long)local_48 + lVar7);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    *(undefined8 *)((long)local_48 + lVar7) = 0;
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  return;
}

Assistant:

void use_unique_pointer() {
    using namespace std;

    unique_ptr<string> films[5] = {
            unique_ptr<string>(new string("The Iron Man")),
            unique_ptr<string>(new string("The amazing four")),
            unique_ptr<string>(new string("Capital America")),
            unique_ptr<string>(new string("The spiderman")),
            unique_ptr<string>(new string("The superman")),
    };

    unique_ptr<string> pwin;
    //  unique pointer cannot be rvalue when assign directly
//    pwin = films[2];
    //  when use std::move to pass ownership, it will be like auto_ptr
    pwin = std::move(films[2]);

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        if (films[i] != nullptr) {
            std::cout << *films[i] << std::endl;
        } else {
            std::cout << i << " is empty" << std::endl;
        }
    }
    std::cout << "The winner is " << *pwin << "!\n";
}